

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O1

Context * Rml::CreateContext(String *name,Vector2i dimensions,
                            RenderInterface *render_interface_for_context,
                            TextInputHandler *text_input_handler_for_context)

{
  code *pcVar1;
  _Head_base<0UL,_Rml::Context_*,_false> _Var2;
  bool bVar3;
  Context *pCVar4;
  __uniq_ptr_impl<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_> *this;
  RenderManager *this_00;
  type puVar5;
  pointer pcVar6;
  char *fmt;
  pointer __p;
  _Head_base<0UL,_Rml::Context_*,_false> context;
  ContextPtr new_context;
  _Head_base<0UL,_Rml::Context_*,_false> local_40;
  RenderInterface *local_38;
  
  if (initialised == '\x01') {
    local_38 = render_interface_for_context;
    if (render_interface_for_context == (RenderInterface *)0x0) {
      local_38 = render_interface;
    }
    if (text_input_handler_for_context == (TextInputHandler *)0x0) {
      text_input_handler_for_context = text_input_handler;
    }
    if (local_38 == (RenderInterface *)0x0) {
      pcVar6 = (name->_M_dataplus)._M_p;
      fmt = 
      "Failed to create context \'%s\', no render interface specified and no default render interface exists."
      ;
    }
    else {
      pCVar4 = GetContext(name);
      if (pCVar4 == (Context *)0x0) {
        if ((core_data._8_8_ == 0) &&
           (bVar3 = Assert("Resource used before it was initialized, or after it was shut down.",
                           "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                           ,0x46), !bVar3)) {
LAB_001efb49:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        this = (__uniq_ptr_impl<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_> *)
               itlib::
               flat_map<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>,std::allocator<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>>>>
               ::operator[]<Rml::RenderInterface*&>
                         ((flat_map<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>,std::allocator<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>>>>
                           *)(core_data._8_8_ + 0x20),&local_38);
        if ((this->_M_t).
            super__Tuple_impl<0UL,_Rml::RenderManager_*,_std::default_delete<Rml::RenderManager>_>.
            super__Head_base<0UL,_Rml::RenderManager_*,_false>._M_head_impl == (RenderManager *)0x0)
        {
          this_00 = (RenderManager *)operator_new(0xe0);
          RenderManager::RenderManager(this_00,local_38);
          local_40._M_head_impl = (Context *)0x0;
          ::std::__uniq_ptr_impl<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>::
          reset(this,this_00);
          ::std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>::
          ~unique_ptr((unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_> *)
                      &local_40);
        }
        Factory::InstanceContext
                  ((Factory *)&local_40,name,
                   (this->_M_t).
                   super__Tuple_impl<0UL,_Rml::RenderManager_*,_std::default_delete<Rml::RenderManager>_>
                   .super__Head_base<0UL,_Rml::RenderManager_*,_false>._M_head_impl,
                   text_input_handler_for_context);
        if (local_40._M_head_impl == (Context *)0x0) {
          context._M_head_impl = (Context *)0x0;
          Log::Message(LT_WARNING,"Failed to instance context \'%s\', instancer returned nullptr.",
                       (name->_M_dataplus)._M_p);
        }
        else {
          Context::SetDimensions(local_40._M_head_impl,dimensions);
          context._M_head_impl = local_40._M_head_impl;
          if ((core_data._8_8_ == 0) &&
             (bVar3 = Assert("Resource used before it was initialized, or after it was shut down.",
                             "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                             ,0x46), !bVar3)) goto LAB_001efb49;
          puVar5 = robin_hood::detail::
                   Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                   ::
                   doCreateByKey<std::__cxx11::string_const&,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>>
                             ((Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                               *)(core_data._8_8_ + 0x38),name);
          _Var2._M_head_impl = local_40._M_head_impl;
          local_40._M_head_impl = (Context *)0x0;
          pCVar4 = (puVar5->_M_t).super___uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>.
                   _M_t.super__Tuple_impl<0UL,_Rml::Context_*,_Rml::Releaser<Rml::Context>_>.
                   super__Head_base<0UL,_Rml::Context_*,_false>._M_head_impl;
          (puVar5->_M_t).super___uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>._M_t.
          super__Tuple_impl<0UL,_Rml::Context_*,_Rml::Releaser<Rml::Context>_>.
          super__Head_base<0UL,_Rml::Context_*,_false>._M_head_impl = _Var2._M_head_impl;
          if (pCVar4 != (Context *)0x0) {
            (**(code **)((long)(pCVar4->super_ScriptInterface).super_Releasable + 0x10))();
          }
          PluginRegistry::NotifyContextCreate(context._M_head_impl);
        }
        if (local_40._M_head_impl != (Context *)0x0) {
          (*((local_40._M_head_impl)->super_ScriptInterface).super_Releasable._vptr_Releasable[2])()
          ;
          return context._M_head_impl;
        }
        return context._M_head_impl;
      }
      pcVar6 = (name->_M_dataplus)._M_p;
      fmt = "Failed to create context \'%s\', context already exists.";
    }
    Log::Message(LT_WARNING,fmt,pcVar6);
  }
  return (Context *)0x0;
}

Assistant:

Context* CreateContext(const String& name, const Vector2i dimensions, RenderInterface* render_interface_for_context,
	TextInputHandler* text_input_handler_for_context)
{
	if (!initialised)
		return nullptr;

	if (!render_interface_for_context)
		render_interface_for_context = render_interface;

	if (!text_input_handler_for_context)
		text_input_handler_for_context = text_input_handler;

	if (!render_interface_for_context)
	{
		Log::Message(Log::LT_WARNING, "Failed to create context '%s', no render interface specified and no default render interface exists.",
			name.c_str());
		return nullptr;
	}

	if (GetContext(name))
	{
		Log::Message(Log::LT_WARNING, "Failed to create context '%s', context already exists.", name.c_str());
		return nullptr;
	}

	// Each unique render interface gets its own render manager.
	auto& render_manager = core_data->render_managers[render_interface_for_context];
	if (!render_manager)
		render_manager = MakeUnique<RenderManager>(render_interface_for_context);

	ContextPtr new_context = Factory::InstanceContext(name, render_manager.get(), text_input_handler_for_context);
	if (!new_context)
	{
		Log::Message(Log::LT_WARNING, "Failed to instance context '%s', instancer returned nullptr.", name.c_str());
		return nullptr;
	}

	new_context->SetDimensions(dimensions);

	Context* new_context_raw = new_context.get();
	core_data->contexts[name] = std::move(new_context);

	PluginRegistry::NotifyContextCreate(new_context_raw);

	return new_context_raw;
}